

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O0

bool __thiscall duckdb::HashJoinLocalSourceState::TaskFinished(HashJoinLocalSourceState *this)

{
  byte bVar1;
  string *msg;
  long in_RDI;
  nullptr_t in_stack_ffffffffffffff98;
  unique_ptr<duckdb::JoinHTScanState,_std::default_delete<duckdb::JoinHTScanState>_>
  *in_stack_ffffffffffffffa0;
  allocator *this_00;
  byte local_51;
  allocator local_31;
  string local_30 [47];
  bool local_1;
  
  bVar1 = *(byte *)(in_RDI + 8);
  if (bVar1 < 2) {
    local_1 = true;
  }
  else if (bVar1 == 2) {
    local_51 = 0;
    if ((*(byte *)(in_RDI + 0x461) & 1) != 0) {
      local_51 = *(byte *)(in_RDI + 0x6f0) ^ 0xff;
    }
    local_1 = (bool)(local_51 & 1);
  }
  else {
    if (bVar1 != 3) {
      msg = (string *)__cxa_allocate_exception(0x10);
      this_00 = &local_31;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_30,"Unexpected HashJoinSourceStage in TaskFinished!",this_00);
      InternalException::InternalException((InternalException *)this_00,msg);
      __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
    }
    local_1 = ::std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return local_1;
}

Assistant:

bool HashJoinLocalSourceState::TaskFinished() const {
	switch (local_stage) {
	case HashJoinSourceStage::INIT:
	case HashJoinSourceStage::BUILD:
		return true;
	case HashJoinSourceStage::PROBE:
		return scan_structure.is_null && !empty_ht_probe_in_progress;
	case HashJoinSourceStage::SCAN_HT:
		return full_outer_scan_state == nullptr;
	default:
		throw InternalException("Unexpected HashJoinSourceStage in TaskFinished!");
	}
}